

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParser.cpp
# Opt level: O0

void __thiscall xercesc_4_0::SAXParser::entityDecl(SAXParser *this)

{
  byte in_CL;
  byte in_DL;
  DTDEntityDecl *in_RSI;
  
  entityDecl((SAXParser *)&this[-1].fElemQNameBuf.fUsed,in_RSI,(bool)(in_DL & 1),(bool)(in_CL & 1));
  return;
}

Assistant:

void SAXParser::entityDecl( const   DTDEntityDecl&  entityDecl
                            , const bool
                            , const bool            isIgnored)
{
    //
    //  If we have a DTD handler, and this entity is not ignored, and
    //  its an unparsed entity, then send this one.
    //
    if (fDTDHandler && !isIgnored)
    {
        if (entityDecl.isUnparsed())
        {
            fDTDHandler->unparsedEntityDecl
            (
                entityDecl.getName()
                , entityDecl.getPublicId()
                , entityDecl.getSystemId()
                , entityDecl.getNotationName()
            );
        }
    }
}